

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CmdLineParser.h
# Opt level: O2

bool __thiscall
axl::sl::CmdLineParser<CmdLineParser,_CmdLineSwitchTable>::parse
          (CmdLineParser<CmdLineParser,_CmdLineSwitchTable> *this,int argc,char **argv)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_50;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)argc;
  if (argc < 1) {
    uVar3 = uVar2;
  }
  do {
    if (uVar3 == uVar2) {
      bVar1 = checkMissingValue(this);
      return bVar1;
    }
    (this->super_CmdLineParserRoot).m_argIdx = (int)uVar2;
    StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(&local_50,argv[uVar2]);
    bVar1 = processArg(this,&local_50);
    StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_50);
    uVar2 = uVar2 + 1;
  } while (bVar1);
  return false;
}

Assistant:

bool
	parse(
		int argc,
		const char* const* argv
	) {
		bool result;

		for (int i = 0; i < argc; i++) {
			m_argIdx = i;
			result = processArg(argv[i]);
			if (!result)
				return false;
		}

		return
			checkMissingValue() &&
			static_cast<T*>(this)->finalize();
	}